

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

int32_t ggml_get_i32_1d(ggml_tensor *tensor,int i)

{
  ggml_type gVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t id [4];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  cVar2 = ggml_is_contiguous();
  if (cVar2 == '\0') {
    local_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    uStack_20 = 0;
    ggml_unravel_index(tensor,(long)i,&local_38,&uStack_30,&uStack_28,&uStack_20);
    iVar3 = ggml_get_i32_nd(tensor,(int)local_38,(int)uStack_30,(int)uStack_28,(int)uStack_20);
  }
  else {
    gVar1 = tensor->type;
    switch(gVar1) {
    case GGML_TYPE_I8:
      if (tensor->nb[0] != 1) {
        pcVar4 = "tensor->nb[0] == sizeof(int8_t)";
        uVar5 = 0x38b;
LAB_0010ca57:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,uVar5,"GGML_ASSERT(%s) failed",pcVar4);
      }
      iVar3 = (int)*(char *)((long)tensor->data + (long)i);
      break;
    case GGML_TYPE_I16:
      if (tensor->nb[0] != 2) {
        pcVar4 = "tensor->nb[0] == sizeof(int16_t)";
        uVar5 = 0x390;
        goto LAB_0010ca57;
      }
      iVar3 = (int)*(short *)((long)tensor->data + (long)i * 2);
      break;
    case GGML_TYPE_I32:
      if (tensor->nb[0] != 4) {
        pcVar4 = "tensor->nb[0] == sizeof(int32_t)";
        uVar5 = 0x395;
        goto LAB_0010ca57;
      }
      iVar3 = *(int *)((long)tensor->data + (long)i * 4);
      break;
    case GGML_TYPE_I64:
    case GGML_TYPE_F64:
    case GGML_TYPE_IQ1_M:
switchD_0010c876_caseD_1b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x3a9,"fatal error");
    case GGML_TYPE_BF16:
      if (tensor->nb[0] != 2) {
        pcVar4 = "tensor->nb[0] == sizeof(ggml_bf16_t)";
        uVar5 = 0x39f;
        goto LAB_0010ca57;
      }
      iVar3 = (int)(float)((uint)*(ushort *)((long)tensor->data + (long)i * 2) << 0x10);
      break;
    default:
      if (gVar1 == GGML_TYPE_F32) {
        if (tensor->nb[0] != 4) {
          pcVar4 = "tensor->nb[0] == sizeof(float)";
          uVar5 = 0x3a4;
          goto LAB_0010ca57;
        }
        iVar3 = (int)*(float *)((long)tensor->data + (long)i * 4);
      }
      else {
        if (gVar1 != GGML_TYPE_F16) goto switchD_0010c876_caseD_1b;
        if (tensor->nb[0] != 2) {
          pcVar4 = "tensor->nb[0] == sizeof(ggml_fp16_t)";
          uVar5 = 0x39a;
          goto LAB_0010ca57;
        }
        iVar3 = (int)*(float *)(&ggml_table_f32_f16 +
                               (ulong)*(ushort *)((long)tensor->data + (long)i * 2) * 4);
      }
    }
  }
  return iVar3;
}

Assistant:

int32_t ggml_get_i32_1d(const struct ggml_tensor * tensor, int i) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        return ggml_get_i32_nd(tensor, id[0], id[1], id[2], id[3]);
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            }
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            }
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_BF16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_bf16_t));
                return GGML_BF16_TO_FP32(((ggml_bf16_t *)(tensor->data))[i]);
            }
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            }
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}